

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O2

void __thiscall cmFileMonitor::StopMonitoring(cmFileMonitor *this)

{
  (*(this->Root->super_cmVirtualDirectoryWatcher).super_cmIBaseWatcher._vptr_cmIBaseWatcher[6])();
  cmVirtualDirectoryWatcher::Reset(&this->Root->super_cmVirtualDirectoryWatcher);
  return;
}

Assistant:

void cmFileMonitor::StopMonitoring()
{
  this->Root->StopWatching();
  this->Root->Reset();
}